

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.h
# Opt level: O1

void __thiscall
Assimp::ComputeSpatialSortProcess::Execute(ComputeSpatialSortProcess *this,aiScene *pScene)

{
  aiMesh *pMesh;
  map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
  *list;
  Logger *this_00;
  vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
  *this_01;
  Base *value;
  ulong uVar1;
  pointer this_02;
  ai_real aVar2;
  allocator_type local_31;
  
  this_00 = DefaultLogger::get();
  Logger::debug(this_00,"Generate spatially-sorted vertex cache");
  this_01 = (vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
             *)operator_new(0x18);
  std::
  vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
  ::vector(this_01,(ulong)pScene->mNumMeshes,&local_31);
  if (pScene->mNumMeshes != 0) {
    this_02 = (this_01->
              super__Vector_base<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar1 = 0;
    do {
      pMesh = pScene->mMeshes[uVar1];
      SpatialSort::Fill(&this_02->first,pMesh->mVertices,pMesh->mNumVertices,0xc,true);
      aVar2 = ComputePositionEpsilon(pMesh);
      this_02->second = aVar2;
      uVar1 = uVar1 + 1;
      this_02 = this_02 + 1;
    } while (uVar1 < pScene->mNumMeshes);
  }
  list = &((this->super_BaseProcess).shared)->pmap;
  value = (Base *)operator_new(0x10);
  value->_vptr_Base = (_func_int **)&PTR__THeapData_00258b08;
  value[1]._vptr_Base = (_func_int **)this_01;
  SetGenericPropertyPtr<Assimp::SharedPostProcessInfo::Base>(list,"$Spat",value,(bool *)0x0);
  return;
}

Assistant:

void Execute( aiScene* pScene)
    {
        typedef std::pair<SpatialSort, ai_real> _Type;
        ASSIMP_LOG_DEBUG("Generate spatially-sorted vertex cache");

        std::vector<_Type>* p = new std::vector<_Type>(pScene->mNumMeshes);
        std::vector<_Type>::iterator it = p->begin();

        for (unsigned int i = 0; i < pScene->mNumMeshes; ++i, ++it) {
            aiMesh* mesh = pScene->mMeshes[i];
            _Type& blubb = *it;
            blubb.first.Fill(mesh->mVertices,mesh->mNumVertices,sizeof(aiVector3D));
            blubb.second = ComputePositionEpsilon(mesh);
        }

        shared->AddProperty(AI_SPP_SPATIAL_SORT,p);
    }